

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_tt_PackFontRangesRenderIntoRects
              (nk_tt_pack_context *spc,nk_tt_fontinfo *info,nk_tt_pack_range *ranges,int num_ranges,
              nk_rp_rect *rects,nk_allocator *alloc)

{
  short sVar1;
  undefined2 uVar2;
  int glyph_index;
  int local_a4;
  float local_a0;
  nk_rp_coord pad;
  int glyph;
  int codepoint;
  int y1;
  int x1;
  int y0;
  int x0;
  int lsb;
  int advance;
  nk_tt_packedchar *bc;
  nk_rp_rect *r;
  float scale;
  float sub_y;
  float sub_x;
  float recip_v;
  float recip_h;
  float fh;
  int old_v_over;
  int old_h_over;
  int return_value;
  int k;
  int j;
  int i;
  nk_allocator *alloc_local;
  nk_rp_rect *rects_local;
  nk_tt_pack_range *pnStack_20;
  int num_ranges_local;
  nk_tt_pack_range *ranges_local;
  nk_tt_fontinfo *info_local;
  nk_tt_pack_context *spc_local;
  
  old_v_over = 1;
  fh = (float)spc->h_oversample;
  recip_h = (float)spc->v_oversample;
  old_h_over = 0;
  _j = alloc;
  alloc_local = (nk_allocator *)rects;
  rects_local._4_4_ = num_ranges;
  pnStack_20 = ranges;
  ranges_local = (nk_tt_pack_range *)info;
  info_local = (nk_tt_fontinfo *)spc;
  for (k = 0; k < rects_local._4_4_; k = k + 1) {
    recip_v = pnStack_20[k].font_size;
    if (recip_v <= 0.0) {
      local_a0 = nk_tt_ScaleForMappingEmToPixels((nk_tt_fontinfo *)ranges_local,-recip_v);
    }
    else {
      local_a0 = nk_tt_ScaleForPixelHeight((nk_tt_fontinfo *)ranges_local,recip_v);
    }
    r._0_4_ = local_a0;
    info_local->glyf = (uint)pnStack_20[k].h_oversample;
    info_local->hhea = (uint)pnStack_20[k].v_oversample;
    sub_x = 1.0 / (float)(uint)info_local->glyf;
    sub_y = 1.0 / (float)(uint)info_local->hhea;
    scale = nk_tt__oversample_shift(info_local->glyf);
    r._4_4_ = nk_tt__oversample_shift(info_local->hhea);
    for (return_value = 0; return_value < pnStack_20[k].num_chars; return_value = return_value + 1)
    {
      bc = (nk_tt_packedchar *)(&alloc_local->userdata + (long)old_h_over * 2);
      if (bc->yoff == 0.0) {
        old_v_over = 0;
      }
      else {
        _lsb = pnStack_20[k].chardata_for_range + return_value;
        if (pnStack_20[k].first_unicode_codepoint_in_range == 0) {
          local_a4 = pnStack_20[k].array_of_unicode_codepoints[return_value];
        }
        else {
          local_a4 = pnStack_20[k].first_unicode_codepoint_in_range + return_value;
        }
        glyph_index = nk_tt_FindGlyphIndex((nk_tt_fontinfo *)ranges_local,local_a4);
        sVar1 = (short)info_local->head;
        *(short *)&bc->xoff = SUB42(bc->xoff,0) + sVar1;
        *(short *)((long)&bc->xoff + 2) = *(short *)((long)&bc->xoff + 2) + sVar1;
        uVar2 = bc->x1;
        bc->x1 = uVar2 - sVar1;
        bc->y1 = bc->y1 - sVar1;
        nk_tt_GetGlyphHMetrics((nk_tt_fontinfo *)ranges_local,glyph_index,&x0,&y0);
        nk_tt_GetGlyphBitmapBox
                  ((nk_tt_fontinfo *)ranges_local,glyph_index,
                   r._0_4_ * (float)(uint)info_local->glyf,r._0_4_ * (float)(uint)info_local->hhea,
                   &x1,&y1,&codepoint,&glyph);
        nk_tt_MakeGlyphBitmapSubpixel
                  ((nk_tt_fontinfo *)ranges_local,
                   (uchar *)(*(long *)&info_local->hmtx + (ulong)*(ushort *)&bc->xoff +
                            (long)(int)((uint)*(ushort *)((long)&bc->xoff + 2) * info_local->loca)),
                   ((uint)bc->x1 - info_local->glyf) + 1,((uint)bc->y1 - info_local->hhea) + 1,
                   info_local->loca,r._0_4_ * (float)(uint)info_local->glyf,
                   r._0_4_ * (float)(uint)info_local->hhea,0.0,0.0,glyph_index,_j);
        if (1 < (uint)info_local->glyf) {
          nk_tt__h_prefilter((uchar *)(*(long *)&info_local->hmtx +
                                       (long)(int)(uint)*(ushort *)&bc->xoff +
                                      (long)(int)((uint)*(ushort *)((long)&bc->xoff + 2) *
                                                 info_local->loca)),(uint)bc->x1,(uint)bc->y1,
                             info_local->loca,info_local->glyf);
        }
        if (1 < (uint)info_local->hhea) {
          nk_tt__v_prefilter((uchar *)(*(long *)&info_local->hmtx +
                                       (long)(int)(uint)*(ushort *)&bc->xoff +
                                      (long)(int)((uint)*(ushort *)((long)&bc->xoff + 2) *
                                                 info_local->loca)),(uint)bc->x1,(uint)bc->y1,
                             info_local->loca,info_local->hhea);
        }
        _lsb->x0 = *(unsigned_short *)&bc->xoff;
        _lsb->y0 = *(unsigned_short *)((long)&bc->xoff + 2);
        _lsb->x1 = *(short *)&bc->xoff + bc->x1;
        _lsb->y1 = *(short *)((long)&bc->xoff + 2) + bc->y1;
        _lsb->xadvance = r._0_4_ * (float)x0;
        _lsb->xoff = (float)x1 * sub_x + scale;
        _lsb->yoff = (float)y1 * sub_y + r._4_4_;
        _lsb->xoff2 = ((float)x1 + (float)bc->x1) * sub_x + scale;
        _lsb->yoff2 = ((float)y1 + (float)bc->y1) * sub_y + r._4_4_;
      }
      old_h_over = old_h_over + 1;
    }
  }
  info_local->glyf = (int)fh;
  info_local->hhea = (int)recip_h;
  return old_v_over;
}

Assistant:

NK_INTERN int
nk_tt_PackFontRangesRenderIntoRects(struct nk_tt_pack_context *spc,
    struct nk_tt_fontinfo *info, struct nk_tt_pack_range *ranges,
    int num_ranges, struct nk_rp_rect *rects, struct nk_allocator *alloc)
{
    int i,j,k, return_value = 1;
    /* save current values */
    int old_h_over = (int)spc->h_oversample;
    int old_v_over = (int)spc->v_oversample;
    /* rects array must be big enough to accommodate all characters in the given ranges */

    k = 0;
    for (i=0; i < num_ranges; ++i)
    {
        float fh = ranges[i].font_size;
        float recip_h,recip_v,sub_x,sub_y;
        float scale = fh > 0 ? nk_tt_ScaleForPixelHeight(info, fh):
            nk_tt_ScaleForMappingEmToPixels(info, -fh);

        spc->h_oversample = ranges[i].h_oversample;
        spc->v_oversample = ranges[i].v_oversample;

        recip_h = 1.0f / (float)spc->h_oversample;
        recip_v = 1.0f / (float)spc->v_oversample;

        sub_x = nk_tt__oversample_shift((int)spc->h_oversample);
        sub_y = nk_tt__oversample_shift((int)spc->v_oversample);

        for (j=0; j < ranges[i].num_chars; ++j)
        {
            struct nk_rp_rect *r = &rects[k];
            if (r->was_packed)
            {
                struct nk_tt_packedchar *bc = &ranges[i].chardata_for_range[j];
                int advance, lsb, x0,y0,x1,y1;
                int codepoint = ranges[i].first_unicode_codepoint_in_range ?
                    ranges[i].first_unicode_codepoint_in_range + j :
                    ranges[i].array_of_unicode_codepoints[j];
                int glyph = nk_tt_FindGlyphIndex(info, codepoint);
                nk_rp_coord pad = (nk_rp_coord) spc->padding;

                /* pad on left and top */
                r->x = (nk_rp_coord)((int)r->x + (int)pad);
                r->y = (nk_rp_coord)((int)r->y + (int)pad);
                r->w = (nk_rp_coord)((int)r->w - (int)pad);
                r->h = (nk_rp_coord)((int)r->h - (int)pad);

                nk_tt_GetGlyphHMetrics(info, glyph, &advance, &lsb);
                nk_tt_GetGlyphBitmapBox(info, glyph, scale * (float)spc->h_oversample,
                        (scale * (float)spc->v_oversample), &x0,&y0,&x1,&y1);
                nk_tt_MakeGlyphBitmapSubpixel(info, spc->pixels + r->x + r->y*spc->stride_in_bytes,
                    (int)(r->w - spc->h_oversample+1), (int)(r->h - spc->v_oversample+1),
                    spc->stride_in_bytes, scale * (float)spc->h_oversample,
                    scale * (float)spc->v_oversample, 0,0, glyph, alloc);

                if (spc->h_oversample > 1)
                   nk_tt__h_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
                        r->w, r->h, spc->stride_in_bytes, (int)spc->h_oversample);

                if (spc->v_oversample > 1)
                   nk_tt__v_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
                        r->w, r->h, spc->stride_in_bytes, (int)spc->v_oversample);

                bc->x0       = (nk_ushort)  r->x;
                bc->y0       = (nk_ushort)  r->y;
                bc->x1       = (nk_ushort) (r->x + r->w);
                bc->y1       = (nk_ushort) (r->y + r->h);
                bc->xadvance = scale * (float)advance;
                bc->xoff     = (float)  x0 * recip_h + sub_x;
                bc->yoff     = (float)  y0 * recip_v + sub_y;
                bc->xoff2    = ((float)x0 + r->w) * recip_h + sub_x;
                bc->yoff2    = ((float)y0 + r->h) * recip_v + sub_y;
            } else {
                return_value = 0; /* if any fail, report failure */
            }
            ++k;
        }
    }
    /* restore original values */
    spc->h_oversample = (unsigned int)old_h_over;
    spc->v_oversample = (unsigned int)old_v_over;
    return return_value;
}